

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

shared_ptr<cppcms::http::file> __thiscall cppcms::widgets::file::value(file *this)

{
  bool bVar1;
  cppcms_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  element_type *in_RDI;
  shared_ptr<cppcms::http::file> sVar2;
  string *in_stack_ffffffffffffff88;
  shared_ptr<cppcms::http::file> *in_stack_ffffffffffffff90;
  allocator local_31;
  string local_30 [48];
  
  bVar1 = base_widget::set((base_widget *)((long)in_RSI + *(long *)(*in_RSI + -0x18)));
  if (!bVar1) {
    this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"File was not loaded",&local_31);
    cppcms_error::cppcms_error(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  std::shared_ptr<cppcms::http::file>::shared_ptr
            (in_stack_ffffffffffffff90,(shared_ptr<cppcms::http::file> *)in_stack_ffffffffffffff88);
  sVar2.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppcms::http::file>)
         sVar2.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<http::file> file::value()
{
	if(!set())
		throw cppcms_error("File was not loaded");
	return file_;
}